

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryption_bogus.cc
# Opt level: O1

fdb_status bogus_crypt(encryptor *e,bool encrypt,void *dst_buf,void *src_buf,size_t size,bid_t bid)

{
  undefined7 in_register_00000031;
  size_t sVar1;
  byte bVar2;
  byte bVar3;
  
  bVar2 = (byte)bid ^ (e->key).bytes[0];
  bVar3 = -bVar2;
  if ((int)CONCAT71(in_register_00000031,encrypt) != 0) {
    bVar3 = bVar2;
  }
  if (size != 0) {
    sVar1 = 0;
    do {
      *(byte *)((long)dst_buf + sVar1) = *(char *)((long)src_buf + sVar1) + bVar3;
      sVar1 = sVar1 + 1;
    } while (size != sVar1);
  }
  return FDB_RESULT_SUCCESS;
}

Assistant:

static fdb_status bogus_crypt(encryptor *e,
                              bool encrypt,
                              void *dst_buf,
                              const void *src_buf,
                              size_t size,
                              bid_t bid)
{
    int8_t delta = (bid & 0xFF) ^ e->key.bytes[0];
    if (!encrypt)
        delta = -delta;
    const uint8_t *src = (const uint8_t *)src_buf;
    uint8_t *dst = (uint8_t *)dst_buf;
    while (size-- > 0) {
        *dst++ = *src++ + delta;
    }
    return FDB_RESULT_SUCCESS;
}